

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O2

MPP_RET hal_h265e_v580_gen_regs(void *hal,HalEncTask *task)

{
  undefined1 uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  int iVar7;
  EncRcTask *pEVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  void *__s;
  uint *puVar12;
  EncRcTask *pEVar13;
  long lVar14;
  long *plVar15;
  RK_U8 aRVar16 [8];
  long lVar17;
  uint3 uVar18;
  RK_U32 RVar19;
  uint uVar20;
  uint uVar21;
  VepuRgb2YuvCfg *pVVar22;
  byte *pbVar23;
  size_t sVar24;
  void *pvVar25;
  undefined8 *puVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  char *fmt;
  hevc_vepu580_control_cfg *reg_ctl;
  byte bVar36;
  short sVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  RK_U32 *pRVar43;
  uint uVar44;
  uint uVar45;
  RK_U32 *pRVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong size;
  uint uVar55;
  int iVar56;
  bool bVar57;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  
  bVar36 = 0;
  pEVar8 = task->rc_task;
  lVar9 = *(long *)((long)hal + 0xd0);
  puVar10 = *(uint **)((long)hal + 0x80);
  lVar11 = *(long *)((long)hal + 200);
  __s = *(void **)(puVar10 + 6);
  puVar12 = *(uint **)((long)hal + 0x110);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xa85);
  }
  uVar2 = *(ushort *)(lVar9 + 4);
  uVar3 = *(ushort *)(lVar9 + 6);
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","frame %d | type %d | start gen regs","hal_h265e_v580_gen_regs",
               (ulong)*puVar10,(ulong)*(uint *)((long)hal + 0xb0));
  }
  memset(__s,0,0x1d08);
  if (1 < *(int *)((long)hal + 0x94)) {
    lVar30 = *(long *)(*(long *)((long)hal + 0x80) + 0x18);
    if (*(int *)(*(long *)((long)hal + 0x80) + 4) == 2) {
      *(undefined8 *)((long)hal + 0x9c) = 0;
      uVar40 = 0x90010;
      uVar33 = 0;
    }
    else {
      uVar33 = *(uint *)((long)hal + 0x9c) & 3;
      uVar40 = 0x90030;
    }
    uVar32 = *(uint *)(lVar30 + 0xe4);
    *(uint *)(lVar30 + 0xe4) = uVar32 & 0xfffffffc | uVar33;
    *(uint *)(lVar30 + 0xe4) =
         (uVar32 & 0xf800ffc0 | uVar33 | uVar40) + (*(uint *)((long)hal + 0xa0) & 3) * 4;
    iVar39 = *(int *)((long)hal + 0x9c);
    *(int *)((long)hal + 0x9c) = iVar39 + 1;
    *(int *)((long)hal + 0xa0) = iVar39;
    if (2 < iVar39) {
      *(undefined4 *)((long)hal + 0x9c) = 0;
    }
  }
  uVar40 = *(uint *)((long)__s + 0x10);
  *(uint *)((long)__s + 0x10) = uVar40 & 0xffffff00;
  *(uint *)((long)__s + 0x10) = uVar40 & 0xfffffc00 | (*(uint *)((long)hal + 0x100) & 3) << 8;
  *(byte *)((long)__s + 0x14) = *(byte *)((long)__s + 0x14) & 0xfc;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffc00 | 0x1f7;
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xe0000000 | 0x8007000;
  *(uint *)((long)__s + 0x34) =
       *(uint *)((long)__s + 0x34) & 0xff00ff7f | (uint)(*(int *)((long)hal + 0xb0) == 0) << 7;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(byte *)((long)__s + 0x54) = *(byte *)((long)__s + 0x54) | 7;
  uVar55 = (uVar2 + 7 >> 3) - 1 & 0x7ff;
  uVar40 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar40 & 0xfffff800 | uVar55;
  uVar32 = *(ushort *)(lVar9 + 4) & 7;
  uVar33 = 8 - uVar32;
  if ((*(ushort *)(lVar9 + 4) & 7) == 0) {
    uVar33 = uVar32;
  }
  uVar33 = *(uint *)((long)__s + 0xf4) & 0xffffffc0 | uVar33;
  *(uint *)((long)__s + 0xf4) = uVar33;
  *(uint *)((long)__s + 0xf0) =
       uVar40 & 0xf800f800 | uVar55 | (uint)uVar3 * 0x2000 + 0x7ffe000 & 0x7ff0000;
  uVar32 = *(ushort *)(lVar9 + 6) & 7;
  uVar40 = (8 - uVar32) * 0x10000;
  if ((*(ushort *)(lVar9 + 6) & 7) == 0) {
    uVar40 = uVar32;
  }
  *(uint *)((long)__s + 0xf4) = uVar33 & 0xffc0ffcf | uVar40;
  uVar40 = *(uint *)((long)__s + 0xe0);
  *(uint *)((long)__s + 0xe0) = uVar40 | 1;
  iVar39 = *(int *)(lVar9 + 0x120);
  dVar58 = log2((double)((uVar3 + 0x3f >> 6) * (uVar2 + 0x3f >> 6)));
  dVar58 = ceil(dVar58);
  *(uint *)((long)__s + 0xe0) =
       (((uint)(long)dVar58 & 0x1f) << 0x13 | uVar40 & 0xff07ffeb | 1) + (uint)(iVar39 == 0) * 4 +
       0x10;
  uVar40 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar40 & 0xc3ffffff | 0x20000000;
  *(uint *)((long)__s + 0x10c) =
       uVar40 & 0x83ffffff | 0x20000000 | (uint)((*(uint *)(lVar9 + 0x10) & 0xf00000) != 0) << 0x1e;
  *(uint *)((long)__s + 600) =
       *(uint *)((long)__s + 600) & 0xfffffff8 | (uint)(*(int *)((long)hal + 0xb0) != 2) * 3;
  pRVar43 = klut_weight;
  pRVar46 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar30 = 0x18; lVar30 != 0; lVar30 = lVar30 + -1) {
    *pRVar46 = *pRVar43;
    pRVar43 = pRVar43 + (ulong)bVar36 * -2 + 1;
    pRVar46 = pRVar46 + (ulong)bVar36 * -2 + 1;
  }
  uVar2 = *(ushort *)(lVar9 + 4);
  uVar40 = uVar2 & 0x1fc;
  if (0x17f < uVar2) {
    uVar40 = 0x180;
  }
  uVar33 = 0x300;
  if (uVar2 < 0x1bc) {
    uVar33 = uVar40;
  }
  uVar3 = *(ushort *)(lVar9 + 6);
  uVar40 = 0x100;
  if (uVar3 < 0x100) {
    uVar40 = uVar3 & 0xfc;
  }
  uVar32 = 0x200;
  if (uVar3 < 0x13c) {
    uVar32 = uVar40;
  }
  uVar28 = uVar2 + 0x3f;
  uVar40 = -((-uVar33 & 0xffff) >> 2) >> 2 & 0x3f;
  uVar55 = -((-uVar32 & 0xffff) >> 2) >> 2 & 0x3f;
  uVar33 = (uint)(int)(short)((short)uVar33 + -4) >> 2;
  uVar33 = (int)((uint)(ushort)((short)uVar33 >> 0xf) << 0x10 | uVar33 & 0xffff) / 4 & 0xffff;
  if (uVar33 <= uVar40) {
    uVar40 = uVar33;
  }
  uVar33 = (uint)(byte)((char)(uVar32 + 0x3fc >> 2) / '\x04');
  if (uVar33 <= uVar55) {
    uVar55 = uVar33;
  }
  *(uint *)((long)__s + 0x150) =
       (*(uint *)((long)__s + 0x150) & 0xc000) + (uVar55 & 0x3c) * 4 + (uVar40 >> 2) + 0x12f00;
  uVar32 = *(uint *)((long)__s + 0x154) & 0xfff00000;
  uVar33 = uVar32 + 0x80505;
  *(uint *)((long)__s + 0x154) = uVar33;
  if (((*(byte *)(lVar9 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0xb0) != 2)) {
    uVar33 = uVar33 & 0xffc80505;
    if (*(int *)((long)hal + 0xb4) != 2) {
      uVar33 = uVar32 | 0x280505;
    }
    *(uint *)((long)__s + 0x154) = uVar33 | 0x100000;
  }
  uVar33 = uVar28 >> 6;
  if (*(ushort *)(lVar9 + 4) < 0xa81) {
    uVar32 = *(uint *)((long)__s + 0x158) & 0xffff07ff;
    if (*(ushort *)(lVar9 + 4) < 0x801) {
      uVar32 = uVar32 | 0xa000;
    }
    else {
      uVar32 = uVar32 | 0x8000;
    }
  }
  else {
    uVar32 = *(uint *)((long)__s + 0x158) & 0xffff07ff | 0x6000;
  }
  uVar41 = (uVar40 >> 2 & 0xc) + 4 >> 1;
  uVar55 = (uVar55 >> 2) + 3 >> 1 | 1;
  uVar40 = uVar32 >> 0xd & 7;
  if (uVar55 <= uVar40) {
    uVar40 = uVar55;
  }
  iVar39 = uVar33 * 2;
  if (uVar41 < uVar33) {
    iVar39 = uVar41 + 1;
  }
  uVar40 = uVar32 & 0xfffcf800 | iVar39 + (uVar40 - 1) * uVar33 & 0x7ff;
  *(uint *)((long)__s + 0x158) = uVar40;
  uVar28 = uVar28 & 0xffffffc0;
  if ((0x200 < uVar28) &&
     (((uVar33 = 0x10000, uVar28 < 0x401 || (uVar33 = 0x20000, uVar28 < 0x801)) ||
      (uVar33 = 0x30000, uVar28 < 0x1001)))) {
    *(uint *)((long)__s + 0x158) = uVar33 | uVar40;
  }
  uVar40 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar40 & 0xff878003 | 0x7836dc;
  uVar33 = uVar40 & 0xff878000 | 0x7836dc;
  uVar40 = uVar33 + 2;
  if (*(char *)(lVar9 + 0x1e) == '\0') {
    uVar40 = uVar33;
  }
  *(uint *)((long)__s + 0x180) = uVar40 | 0x800000;
  *(uint *)((long)__s + 0x180) =
       uVar40 & 0xfcffb6de | 0x800000 | (*(uint *)(lVar9 + 0x24) & 1) << 0x18;
  uVar40 = 1;
  if (*(int *)((long)hal + 0xb0) == 2) {
    uVar40 = 0x13;
  }
  if (*(int *)(lVar9 + 0x124) != 0) {
    uVar40 = 3;
  }
  *(uint *)((long)__s + 400) = *(uint *)((long)__s + 400) & 0xffffffc0 | uVar40;
  vepu580_h265_set_hw_address((H265eV580HalContext *)hal,task);
  lVar30 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar12[4] & 0xf) << 4;
  uVar40 = (*(uint *)((long)__s + 0xf8) & 0xffffffc3) + (*puVar12 & 0xf) * 4;
  *(uint *)((long)__s + 0xf8) = uVar40;
  uVar33 = puVar12[1];
  *(uint *)((long)__s + 0xf8) = uVar40 & 0xfffffffe | uVar33 & 1;
  uVar40 = (uVar40 & 0xfffffffc | uVar33 & 1) + (puVar12[2] & 1) * 2;
  *(uint *)((long)__s + 0xf8) = uVar40;
  uVar55 = (uint)(*(int *)(lVar30 + 0x24) != 0xc) << 7;
  uVar32 = uVar40 & 0xffffff7f | uVar55;
  *(uint *)((long)__s + 0xf8) = uVar32;
  uVar33 = *(uint *)((long)__s + 0x10c);
  uVar28 = (uint)(0 < *(int *)(lVar30 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar33 & 0xfbffffff | uVar28;
  *(uint *)((long)__s + 0x10c) =
       uVar33 & 0xe3ffffff | uVar28 | (*(uint *)(lVar30 + 0x50) & 3) << 0x1b;
  if ((*(uint *)(lVar30 + 0x24) & 0xfffc) < 0x14 && (*(uint *)(lVar30 + 0x24) & 0xf0000) == 0) {
    uVar32 = uVar32 | 0x40;
  }
  else {
    uVar32 = uVar40 & 0xffffff3f | uVar55 | (uint)(*(int *)(lVar30 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar32;
  if ((*(byte *)(lVar30 + 0x26) & 0xf0) == 0) {
    RVar19 = *(RK_U32 *)(lVar30 + 0x14);
    if (RVar19 != 0) goto LAB_00242c0e;
    uVar40 = *puVar12;
    switch(uVar40) {
    case 0:
      RVar19 = *(int *)(lVar30 + 0xc) << 2;
      break;
    case 1:
      RVar19 = *(int *)(lVar30 + 0xc) * 3;
      break;
    case 2:
    case 8:
    case 9:
      RVar19 = *(int *)(lVar30 + 0xc) * 2;
      goto LAB_00242c0e;
    default:
      RVar19 = *(RK_U32 *)(lVar30 + 0xc);
      goto LAB_00242c11;
    }
switchD_00242c27_caseD_5:
    sVar37 = (short)((int)RVar19 / 2);
  }
  else {
    RVar19 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (RVar19 == 0) {
      RVar19 = *(int *)(lVar30 + 0xc) + 0xfU & 0xfffffff0;
    }
LAB_00242c0e:
    uVar40 = *puVar12;
LAB_00242c11:
    sVar37 = (short)RVar19;
    switch(uVar40) {
    case 4:
    case 6:
    case 0xd:
      break;
    default:
      goto switchD_00242c27_caseD_5;
    case 0xc:
      sVar37 = sVar37 * 2;
    }
  }
  if ((*(uint *)((long)__s + 0xf8) & 0x3c) < 0xc) {
    pVVar22 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar30 + 0x34),
                              *(MppFrameColorSpace *)(lVar30 + 0x28));
    bVar57 = true;
    if ((hal_h265e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","input color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)*(uint *)(lVar30 + 0x34),(ulong)*(uint *)(lVar30 + 0x28));
      bVar57 = (hal_h265e_debug & 2) == 0;
    }
    uVar33 = ((ushort)(pVVar22->_2y).r_coeff & 0x1ff) << 0x12;
    uVar40 = *(uint *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0xfc) = uVar40 & 0xf803ffff | uVar33;
    uVar32 = ((ushort)(pVVar22->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0xfc) = uVar40 & 0xf80001ff | uVar33 | uVar32;
    *(uint *)((long)__s + 0xfc) =
         uVar40 & 0xf8000000 | uVar33 | uVar32 | (ushort)(pVVar22->_2y).b_coeff & 0x1ff;
    uVar33 = ((ushort)(pVVar22->_2u).r_coeff & 0x1ff) << 0x12;
    uVar40 = *(uint *)((long)__s + 0x100);
    *(uint *)((long)__s + 0x100) = uVar40 & 0xf803ffff | uVar33;
    uVar32 = ((ushort)(pVVar22->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x100) = uVar40 & 0xf80001ff | uVar33 | uVar32;
    *(uint *)((long)__s + 0x100) =
         uVar40 & 0xf8000000 | uVar33 | uVar32 | (ushort)(pVVar22->_2u).b_coeff & 0x1ff;
    uVar33 = ((ushort)(pVVar22->_2v).r_coeff & 0x1ff) << 0x12;
    uVar40 = *(uint *)((long)__s + 0x104);
    *(uint *)((long)__s + 0x104) = uVar40 & 0xf803ffff | uVar33;
    uVar32 = ((ushort)(pVVar22->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x104) = uVar40 & 0xf80001ff | uVar33 | uVar32;
    *(uint *)((long)__s + 0x104) =
         uVar40 & 0xf8000000 | uVar33 | uVar32 | (ushort)(pVVar22->_2v).b_coeff & 0x1ff;
    uVar40 = *(uint *)((long)__s + 0x108);
    uVar33 = ((ushort)(pVVar22->_2y).offset & 0x1f) << 0x10;
    *(uint *)((long)__s + 0x108) = uVar40 & 0xffe0ffff | uVar33;
    uVar40 = uVar40 & 0xffe000ff | uVar33 | ((ushort)(pVVar22->_2u).offset & 0xff) << 8;
    *(uint *)((long)__s + 0x108) = uVar40;
    *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar40 >> 8),(char)(pVVar22->_2v).offset);
    if (!bVar57) {
      _mpp_log_l(4,"hal_h265e_v580","use color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)pVVar22->dst_range,(ulong)pVVar22->color);
    }
  }
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | RVar19 & 0x1ffff;
  *(short *)((long)__s + 0x118) = sVar37;
  pEVar13 = task->rc_task;
  lVar30 = *(long *)((long)hal + 200);
  if (*(int *)(lVar30 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar13->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar13->info).quality_target & 0x3fU) << 0x10;
    uVar40 = *(uint *)((long)__s + 0x134);
    uVar33 = ((pEVar13->info).quality_target & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar40 & 0xfc0fffff | uVar33;
    *(uint *)((long)__s + 0x134) =
         uVar40 & 0xfffff | uVar33 | (pEVar13->info).quality_target << 0x1a;
  }
  else {
    uVar32 = *(ushort *)(*(long *)((long)hal + 0xd0) + 4) + 0x3f >> 6;
    uVar33 = ((pEVar13->info).bit_target << 4) /
             (int)((*(ushort *)(*(long *)((long)hal + 0xd0) + 6) + 0x3f >> 6) * uVar32);
    uVar40 = 0x50000;
    if (uVar33 < 0x100000) {
      uVar40 = uVar33;
    }
    uVar55 = (uVar40 * uVar32 >> 4) * 5 >> 4;
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar13->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar13->info).quality_target & 0x3fU) << 0x10;
    *(uint *)((long)__s + 0x130) = uVar32 * 0x1000 + (*(uint *)((long)__s + 0x130) & 0xff8) + 7;
    uVar32 = (*(uint *)(lVar30 + 0x17c + (ulong)(*(int *)((long)hal + 0xb0) == 2) * 4) & 0xf) <<
             0x10;
    uVar33 = *(uint *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) = uVar33 & 0xfff0ffff | uVar32;
    uVar28 = ((pEVar13->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar33 & 0xfc00ffff | uVar32 | uVar28;
    uVar41 = (pEVar13->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x134) = uVar33 & 0xffff | uVar32 | uVar28 | uVar41;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar40 & 0xfffff;
    *(uint *)((long)__s + 0x1e0) = uVar55 * -2;
    *(uint *)((long)__s + 0x1e4) = -uVar55;
    *(uint *)((long)__s + 0x1e8) = uVar55;
    *(uint *)((long)__s + 0x1ec) = uVar55 * 2;
    *(undefined8 *)((long)__s + 0x1f0) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x1f8) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xfff00000;
    if (*(int *)(lVar30 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar33 & 0xffff | uVar28 | uVar41;
    }
  }
  uVar40 = (uint)*(byte *)(lVar30 + 0x3b0);
  if (*(byte *)(lVar30 + 0x3b0) == 0) {
    uVar40 = (pEVar13->info).quality_min;
  }
  uVar33 = *(uint *)((long)__s + 0x208);
  uVar40 = uVar40 & 0x3f;
  *(uint *)((long)__s + 0x208) = uVar33 & 0xffffffc0 | uVar40;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3a8);
  if (*(byte *)(lVar30 + 0x3a8) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  uVar55 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x208) = uVar33 & 0xfffff000 | uVar40 | uVar55;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b1);
  if (*(byte *)(lVar30 + 0x3b1) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  uVar28 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x208) = uVar33 & 0xfffc0000 | uVar40 | uVar55 | uVar28;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3a9);
  if (*(byte *)(lVar30 + 0x3a9) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  uVar41 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x208) = uVar33 & 0xff000000 | uVar40 | uVar55 | uVar28 | uVar41;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b2);
  if (*(byte *)(lVar30 + 0x3b2) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  *(uint *)((long)__s + 0x208) =
       uVar33 & 0xc0000000 | uVar40 | uVar55 | uVar28 | uVar41 | (uVar32 & 0x3f) << 0x18;
  uVar40 = (uint)*(byte *)(lVar30 + 0x3aa);
  if (*(byte *)(lVar30 + 0x3aa) == 0) {
    uVar40 = (pEVar13->info).quality_max;
  }
  uVar33 = *(uint *)((long)__s + 0x20c);
  uVar40 = uVar40 & 0x3f;
  *(uint *)((long)__s + 0x20c) = uVar33 & 0xffffffc0 | uVar40;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b3);
  if (*(byte *)(lVar30 + 0x3b3) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  uVar55 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x20c) = uVar33 & 0xfffff000 | uVar40 | uVar55;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ab);
  if (*(byte *)(lVar30 + 0x3ab) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  uVar28 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x20c) = uVar33 & 0xfffc0000 | uVar40 | uVar55 | uVar28;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b4);
  if (*(byte *)(lVar30 + 0x3b4) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  uVar41 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x20c) = uVar33 & 0xff000000 | uVar40 | uVar55 | uVar28 | uVar41;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ac);
  if (*(byte *)(lVar30 + 0x3ac) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  *(uint *)((long)__s + 0x20c) =
       uVar33 & 0xc0000000 | uVar40 | uVar55 | uVar28 | uVar41 | (uVar32 & 0x3f) << 0x18;
  uVar40 = (uint)*(byte *)(lVar30 + 0x3b5);
  if (*(byte *)(lVar30 + 0x3b5) == 0) {
    uVar40 = (pEVar13->info).quality_min;
  }
  uVar33 = *(uint *)((long)__s + 0x210);
  uVar40 = uVar40 & 0x3f;
  *(uint *)((long)__s + 0x210) = uVar33 & 0xffffffc0 | uVar40;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ad);
  if (*(byte *)(lVar30 + 0x3ad) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  uVar55 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x210) = uVar33 & 0xfffff000 | uVar40 | uVar55;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b6);
  if (*(byte *)(lVar30 + 0x3b6) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  uVar28 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x210) = uVar33 & 0xfffc0000 | uVar40 | uVar55 | uVar28;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ae);
  if (*(byte *)(lVar30 + 0x3ae) == 0) {
    uVar32 = (pEVar13->info).quality_max;
  }
  uVar41 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x210) = uVar33 & 0xff000000 | uVar40 | uVar55 | uVar28 | uVar41;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b7);
  if (*(byte *)(lVar30 + 0x3b7) == 0) {
    uVar32 = (pEVar13->info).quality_min;
  }
  *(uint *)((long)__s + 0x210) =
       uVar33 & 0xc0000000 | uVar40 | uVar55 | uVar28 | uVar41 | (uVar32 & 0x3f) << 0x18;
  uVar40 = (uint)*(byte *)(lVar30 + 0x3af);
  if (*(byte *)(lVar30 + 0x3af) == 0) {
    uVar40 = (pEVar13->info).quality_max;
  }
  uVar33 = *(uint *)((long)__s + 0x194);
  uVar32 = *(uint *)((long)__s + 0x214);
  *(uint *)((long)__s + 0x214) = uVar32 & 0xffffffc0 | uVar40 & 0x3f;
  *(uint *)((long)__s + 0x214) =
       uVar32 & 0x3fffffc0 | uVar40 & 0x3f | *(int *)(lVar30 + 0x3b8) << 0x1e;
  uVar40 = *(uint *)(lVar9 + 0x24) >> 2 & 1;
  *(uint *)((long)__s + 0x194) = uVar33 & 0xfffffffe | uVar40;
  uVar32 = (uint)(byte)(*(char *)(lVar9 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x194) = uVar33 & 0xffffff00 | uVar40 | uVar32;
  uVar55 = (*(byte *)(lVar9 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x194) = uVar33 & 0xffff8100 | uVar40 | uVar32 | uVar55;
  uVar28 = *(uint *)(lVar9 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x194) = uVar33 & 0xffff8000 | uVar40 | uVar32 | uVar55 | uVar28;
  uVar41 = *(uint *)(lVar9 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x194) = uVar33 & 0xffff0000 | uVar40 | uVar32 | uVar55 | uVar28 | uVar41;
  uVar42 = (*(uint *)(lVar9 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x194) =
       uVar33 & 0xfff00000 | uVar40 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42;
  *(uint *)((long)__s + 0x194) =
       (uVar33 & 0xffe00000 | uVar40 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42) +
       (*(uint *)(lVar9 + 0x24) & 0x80000) * 2;
  uVar33 = *(uint *)(lVar9 + 0x24) >> 0x14 & 1;
  uVar40 = *(uint *)((long)__s + 0x198);
  *(uint *)((long)__s + 0x198) = uVar40 & 0xfffffffe | uVar33;
  uVar32 = *(uint *)(lVar9 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x198) = uVar40 & 0xfffffffc | uVar33 | uVar32;
  uVar55 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x198) = uVar40 & 0xffffffe0 | uVar33 | uVar32 | uVar55;
  uVar28 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x198) = uVar40 & 0xffffffc0 | uVar33 | uVar32 | uVar55 | uVar28;
  uVar41 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x198) = uVar40 & 0xffffff80 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41;
  uVar42 = (uint)(*(char *)(lVar9 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xffffe000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42;
  uVar34 = (*(uint *)(lVar9 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xffffc000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34;
  uVar48 = (*(uint *)(lVar9 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xffff8000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34 | uVar48;
  uVar49 = (*(uint *)(lVar9 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xffff0000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34 | uVar48 |
       uVar49;
  uVar47 = (*(uint *)(lVar9 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xfffe0000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34 | uVar48 |
       uVar49 | uVar47;
  uVar40 = (uVar40 & 0xfffc0000 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34 |
            uVar48 | uVar49 | uVar47) + (*(uint *)(lVar9 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x198) = uVar40;
  uVar40 = (uVar40 & 0xfffbffff) + (*(uint *)(lVar9 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x198) = uVar40;
  uVar33 = (*(byte *)(lVar9 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x198) = uVar40 & 0xffe7ffff | uVar33;
  *(uint *)((long)__s + 0x198) =
       uVar40 & 0xffc7ffff | uVar33 | (*(uint *)(lVar9 + 0x28) & 0x400) << 0xb;
  uVar33 = *(uint *)(lVar9 + 0xe4) >> 4 & 1;
  uVar40 = *(uint *)((long)__s + 0x19c);
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfffffffe | uVar33;
  uVar32 = *(uint *)(lVar9 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfffffffc | uVar33 | uVar32;
  uVar55 = *(uint *)(lVar9 + 0xe4) >> 4 & 4;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfffffff8 | uVar33 | uVar32 | uVar55;
  uVar28 = *(uint *)(lVar9 + 0xe4) >> 4 & 8;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfffffff0 | uVar33 | uVar32 | uVar55 | uVar28;
  uVar41 = *(uint *)(lVar9 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xffffffd0 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41;
  uVar42 = (uint)(byte)(*(char *)(lVar9 + 0xf0) << 6);
  *(uint *)((long)__s + 0x19c) =
       uVar40 & 0xffffff10 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42;
  uVar34 = (*(byte *)(lVar9 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x19c) =
       uVar40 & 0xfffffc10 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34;
  uVar40 = (uVar40 & 0xfffff810 | uVar33 | uVar32 | uVar55 | uVar28 | uVar41 | uVar42 | uVar34) +
           (*(uint *)(lVar9 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x19c) = uVar40;
  uVar40 = (uVar40 & 0xfffff7ff) + (*(uint *)(lVar9 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x19c) = uVar40;
  uVar40 = (uVar40 & 0xffffefff) + (*(uint *)(lVar9 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x19c) = uVar40;
  uVar40 = (uVar40 & 0xffffdfff) + (*(uint *)(lVar9 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar40;
  *(uint *)((long)__s + 0xe0) =
       *(uint *)((long)__s + 0xe0) & 0xfff83fff | (*(uint *)(lVar9 + 0x11c) & 0x1f) << 0xe;
  uVar40 = (uVar40 & 0xffffbfff) + (*(uint *)(lVar9 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar40;
  uVar28 = (*(byte *)(lVar9 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfffe7fff | uVar28;
  uVar41 = (*(byte *)(lVar9 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xff007fff | uVar28 | uVar41;
  uVar42 = (*(uint *)(lVar9 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0xfe007fff | uVar28 | uVar41 | uVar42;
  uVar34 = (*(byte *)(lVar9 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0x80007fff | uVar28 | uVar41 | uVar42 | uVar34;
  uVar47 = (*(uint *)(lVar9 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x19c) = uVar40 & 0x7fff | uVar28 | uVar41 | uVar42 | uVar34 | uVar47;
  uVar33 = *(uint *)((long)__s + 0x1a0);
  uVar48 = *(byte *)(lVar9 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x1a0) = uVar33 & 0xfffffff0 | uVar48;
  uVar49 = (uint)(byte)(*(char *)(lVar9 + 0xeb) << 4);
  *(uint *)((long)__s + 0x1a0) = uVar33 & 0xffffff00 | uVar48 | uVar49;
  uVar51 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x1a0) = uVar33 & 0xfffffe00 | uVar48 | uVar49 | uVar51;
  uVar32 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x1a0) = uVar33 & 0xfffffc00 | uVar48 | uVar49 | uVar51 | uVar32;
  uVar55 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x1a0) = uVar33 & 0xfffff800 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55;
  pbVar23 = (byte *)(lVar9 + 0xec);
  if ((*(byte *)(lVar9 + 0x28) & 8) == 0) {
    pbVar23 = (byte *)(lVar9 + 0x2c);
  }
  uVar20 = (*pbVar23 & 0x1f) << 0xb;
  *(uint *)((long)__s + 0x1a0) =
       uVar33 & 0xffff0000 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55 | uVar20;
  uVar21 = (*(byte *)(lVar9 + 0xee) & 3) << 0x16;
  *(uint *)((long)__s + 0x1a0) =
       uVar33 & 0xff3f0000 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55 | uVar20 | uVar21;
  uVar29 = (*(uint *)(lVar9 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar33 & 0xfd3f0000 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55 | uVar20 | uVar21 | uVar29;
  uVar52 = (*(uint *)(lVar9 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar33 & 0xf93f0000 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55 | uVar20 | uVar21 | uVar29 |
       uVar52;
  uVar38 = CONCAT22(*(undefined2 *)((long)__s + 0x1a6),*(undefined2 *)(lVar9 + 0xfc));
  *(uint *)((long)__s + 0x1a4) = uVar38;
  *(uint *)((long)__s + 0x1a4) = uVar38 & 0xfe00ffff | (*(ushort *)(lVar9 + 0xfe) & 0x1ff) << 0x10;
  uVar53 = *(uint *)(lVar9 + 0xe4) >> 0x15 & 1;
  uVar38 = *(uint *)((long)__s + 0x1a8);
  *(uint *)((long)__s + 0x1a8) = uVar38 & 0xfffffffe | uVar53;
  uVar38 = (uVar38 & 0xfffe0000 | uVar53) + (uint)*(ushort *)(lVar9 + 0x100) * 2;
  *(uint *)((long)__s + 0x1a8) = uVar38;
  *(uint *)((long)__s + 0x1a8) = uVar38 & 0xff3fffff | (*(byte *)(lVar9 + 0xf6) & 3) << 0x16;
  uVar38 = (*(uint *)((long)__s + 0x1ac) & 0xfbffffff) + (*(uint *)(lVar9 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar53 = (uint)*(ushort *)(lVar9 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar38 & 0xfc0003ff | uVar53;
  uVar38 = (uVar38 & 0xdc0003ff | uVar53) + (*(uint *)(lVar9 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar38 = (uVar38 & 0xbfffffff) + (*(uint *)(lVar9 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar38 = (uVar38 & 0x7fffffff) + (*(uint *)(lVar9 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar38 = (uVar38 & 0xfbffffff) + (*(uint *)(lVar9 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar53 = (uint)*(ushort *)(lVar9 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar38 & 0xfc0003ff | uVar53;
  uVar38 = (uVar38 & 0xf40003ff | uVar53) + (*(uint *)(lVar9 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar38;
  uVar53 = (*(byte *)(lVar9 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x1ac) = uVar38 & 0xfffffc1f | uVar53;
  uVar44 = *(uint *)(lVar9 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x1ac) = uVar38 & 0xfffffc0f | uVar53 | uVar44;
  uVar45 = *(byte *)(lVar9 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x1ac) = uVar38 & 0xfffffc00 | uVar53 | uVar44 | uVar45;
  uVar4 = *(undefined2 *)(lVar9 + 0x108);
  *(undefined2 *)((long)__s + 0x1b0) = uVar4;
  *(uint *)((long)__s + 0x1b0) = CONCAT22(*(undefined2 *)(lVar9 + 0x10a),uVar4);
  uVar4 = *(undefined2 *)(lVar9 + 0x10c);
  *(undefined2 *)((long)__s + 0x1b4) = uVar4;
  *(uint *)((long)__s + 0x1b4) = CONCAT22(*(undefined2 *)(lVar9 + 0x10e),uVar4);
  uVar4 = *(undefined2 *)(lVar9 + 0x110);
  *(undefined2 *)((long)__s + 0x1b8) = uVar4;
  uVar5 = *(undefined2 *)(lVar9 + 0x114);
  *(undefined2 *)((long)__s + 0x1bc) = uVar5;
  *(uint *)((long)__s + 0x1b8) = CONCAT22(*(undefined2 *)(lVar9 + 0x112),uVar4);
  *(uint *)((long)__s + 0x1ac) =
       (uVar38 & 0xeffffc00 | uVar53 | uVar44 | uVar45) + (*(uint *)(lVar9 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x1bc) = CONCAT22(*(undefined2 *)(lVar9 + 0x116),uVar5);
  *(uint *)((long)__s + 0x1a0) =
       uVar33 & 0x813f0000 | uVar48 | uVar49 | uVar51 | uVar32 | uVar55 | uVar20 | uVar21 | uVar29 |
       uVar52 | (*(byte *)(lVar9 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x19c) =
       uVar40 & 0x7fdf | uVar28 | uVar41 | uVar42 | uVar34 | uVar47 |
       *(uint *)(lVar9 + 0xe4) >> 3 & 0x20;
  vepu580_set_osd((Vepu541OsdCfg *)(*(long *)((long)hal + 0x80) + 0x1c8));
  puVar26 = *(undefined8 **)(*(long *)((long)hal + 0x80) + 0x1f8);
  if (puVar26 != (undefined8 *)0x0) {
    iVar39 = (*(int *)(*(long *)((long)hal + 200) + 0x10) + 0x3f >> 6) *
             (*(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3f >> 6);
    sVar24 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar26,"vepu580_h265_set_roi_regs");
    if (sVar24 < (uint)(iVar39 * 0x40)) {
      _mpp_log_l(2,"hal_h265e_v580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar56 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar26,"vepu580_h265_set_roi_regs");
      *(int *)((long)__s + 0xa8) = iVar56;
    }
    if ((*(byte *)(puVar26 + 4) & 1) != 0) {
      sVar24 = mpp_buffer_get_size_with_caller((MppBuffer)puVar26[1],"vepu580_h265_set_roi_regs");
      if (sVar24 < (uint)(iVar39 * 0x100)) {
        _mpp_log_l(2,"hal_h265e_v580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar56 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar26[1],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xac) = iVar56;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar26 + 4) & 2) != 0) {
      sVar24 = mpp_buffer_get_size_with_caller((MppBuffer)puVar26[2],"vepu580_h265_set_roi_regs");
      if (sVar24 < (uint)(iVar39 * 0x200)) {
        _mpp_log_l(2,"hal_h265e_v580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar56 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar26[2],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb0) = iVar56;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar26 + 4) & 4) != 0) {
      sVar24 = mpp_buffer_get_size_with_caller((MppBuffer)puVar26[3],"vepu580_h265_set_roi_regs");
      if (sVar24 < (uint)(iVar39 * 4)) {
        _mpp_log_l(2,"hal_h265e_v580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar39 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar26[3],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb4) = iVar39;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  uVar31 = (pEVar8->frm).val;
  if ((uVar31 >> 0x26 & 1) != 0) {
    lVar30 = *(long *)((long)hal + 0x80);
    lVar27 = *(long *)((long)hal + 200);
    uVar31 = (long)(uVar31 >> 0x30) % (long)*(int *)(lVar27 + 0xc4);
    uVar35 = uVar31 & 0xffffffff;
    lVar14 = *(long *)(lVar30 + 0x18);
    puVar26 = *(undefined8 **)(lVar30 + 0x1f8);
    iVar39 = *(int *)(lVar27 + 0xc);
    iVar56 = *(int *)(lVar27 + 0x10);
    if ((hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","enter\n","setup_intra_refresh");
      lVar27 = *(long *)((long)hal + 200);
    }
    if (*(int *)(lVar27 + 0x164) == 0) {
      uVar40 = 0xfffffffa;
    }
    else {
      uVar33 = iVar39 + 0x3f;
      uVar40 = iVar56 + 0x3fU >> 6;
      uVar32 = (uVar33 & 0xffffffc0) * uVar40;
      size = (ulong)uVar32;
      if (*(long *)(lVar30 + 0x1f8) == 0) {
        if (*(int *)(lVar30 + 0x210) < (int)uVar32) {
          if (*(long *)((long)hal + 0xb8) == 0) {
            mpp_buffer_group_get
                      ((MppBufferGroup *)((long)hal + 0xb8),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                       "hal_h265e_v580","setup_intra_refresh");
          }
          if (*(MppBuffer *)(lVar30 + 0x200) != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(*(MppBuffer *)(lVar30 + 0x200),"setup_intra_refresh");
          }
          if (*(void **)(lVar30 + 0x208) != (void *)0x0) {
            mpp_osal_free("setup_intra_refresh",*(void **)(lVar30 + 0x208));
          }
          *(undefined8 *)(lVar30 + 0x208) = 0;
          pvVar25 = mpp_osal_malloc("setup_intra_refresh",size);
          *(void **)(lVar30 + 0x208) = pvVar25;
          mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)hal + 0xb8),(MppBuffer *)(lVar30 + 0x200),size,
                     "hal_h265e_v580","setup_intra_refresh");
        }
        puVar26 = (undefined8 *)(lVar30 + 0x200);
      }
      uVar33 = uVar33 >> 6;
      pvVar25 = mpp_buffer_get_ptr_with_caller((MppBuffer)*puVar26,"setup_intra_refresh");
      iVar39 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar26,"setup_intra_refresh");
      *(uint *)(lVar30 + 0x210) = uVar32;
      memset(*(void **)(lVar30 + 0x208),0,size);
      uVar32 = *(uint *)(*(long *)((long)hal + 200) + 0x16c);
      iVar56 = (int)uVar31;
      uVar31 = (ulong)(uVar32 * iVar56 - 1);
      if (iVar56 == 0) {
        uVar31 = uVar35;
      }
      uVar28 = (uint)uVar31;
      uVar55 = (uVar32 - (iVar56 == 0)) + uVar28;
      if (*(int *)(*(long *)((long)hal + 200) + 0x168) == 0) {
        uVar41 = uVar33 - 1;
        uVar28 = 0;
      }
      else {
        uVar31 = 0;
        uVar41 = uVar55;
        uVar55 = uVar40 - 1;
      }
      uVar42 = uVar33 - 1;
      if ((int)uVar41 < (int)uVar33) {
        uVar42 = uVar41;
      }
      uVar41 = uVar40 - 1;
      if ((int)uVar55 < (int)uVar40) {
        uVar41 = uVar55;
      }
      if ((hal_h265e_debug & 8) != 0) {
        uVar54 = 0;
        if (0 < (int)uVar28) {
          uVar54 = (ulong)uVar28;
        }
        uVar50 = 0;
        if (0 < (int)uVar31) {
          uVar50 = uVar31;
        }
        _mpp_log_l(4,"hal_h265e_v580",
                   "size in ctu : %d x %d, refresh_num %d, refresh_idx %d, area x[%d, %d], y[%d, %d]"
                   ,(char *)0x0,(ulong)uVar33,(ulong)uVar40,(ulong)uVar32,uVar35,uVar54,
                   (ulong)uVar42,uVar50,(ulong)uVar41);
      }
      lVar27 = *(long *)(lVar30 + 0x208);
      for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
        for (uVar55 = 0; uVar33 != uVar55; uVar55 = uVar55 + 1) {
          if (((int)uVar55 <= (int)uVar42 &&
               ((int)uVar31 <= (int)uVar32 && (int)uVar32 <= (int)uVar41)) &&
             ((int)uVar28 <= (int)uVar55)) {
            *(undefined8 *)(lVar27 + 0x16) = 0x5555555555555555;
            *(undefined8 *)(lVar27 + 0x1e) = 0x5555555555555555;
            *(undefined4 *)(lVar27 + 0x26) = 0x55555555;
            *(undefined1 *)(lVar27 + 0x15) = 0x54;
            *(undefined1 *)(lVar27 + 0x2a) = 5;
          }
          lVar27 = lVar27 + 0x40;
        }
      }
      memcpy(pvVar25,*(void **)(lVar30 + 0x208),size);
      iVar56 = *(int *)(*(long *)((long)hal + 200) + 0x168);
      if (iVar56 == 0) {
        uVar40 = 0x10;
        uVar33 = 0xffffff0f;
LAB_00244022:
        *(uint *)(lVar14 + 0x150) = uVar33 & *(uint *)(lVar14 + 0x150) | uVar40;
      }
      else if (iVar56 == 1) {
        uVar33 = 0xfffffff0;
        uVar40 = 1;
        goto LAB_00244022;
      }
      *(byte *)(lVar14 + 0xe0) = *(byte *)(lVar14 + 0xe0) | 2;
      *(int *)(lVar14 + 0xa8) = iVar39;
      uVar40 = 0;
      mpp_buffer_sync_end_f(*(MppBuffer *)(lVar30 + 0x200),0,"setup_intra_refresh");
    }
    if ((hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","setup_intra_refresh",(ulong)uVar40);
    }
  }
  if (((*(int *)(lVar11 + 0x1868) == 0) || ((pEVar8->info).complex_scene != 0)) ||
     ((*(int *)(lVar11 + 0x94) != 4 ||
      ((task->md_info == (MppBuffer)0x0 || (*(int *)(lVar11 + 0x1864) != 1)))))) goto LAB_00244272;
  lVar30 = *(long *)((long)hal + 200);
  iVar39 = (*(int *)(lVar30 + 0x10) + 0x3f >> 6) * (*(int *)(lVar30 + 0xc) + 0x3f >> 6);
  *(int *)((long)hal + 0x17c) = iVar39 * 0x40;
  *(int *)((long)hal + 0x180) = iVar39 * 0xc0;
  *(int *)((long)hal + 0x184) = iVar39 * 0x10;
  if (*(int *)(lVar30 + 0x1868) == 0) {
    uVar31 = 0;
    _mpp_log_l(4,"hal_h265e_v580","deblurring is closed!\n",(char *)0x0);
    bVar57 = true;
    goto LAB_0024422a;
  }
  if ((*(long *)((long)hal + 0x160) == 0) &&
     (mpp_buffer_get_with_tag
                ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x160),(long)(iVar39 * 0x40),
                 "hal_h265e_v580","vepu580_setup_qpmap_buf"),
     *(MppBuffer *)((long)hal + 0x160) == (MppBuffer)0x0)) {
    fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
LAB_00244217:
    bVar57 = false;
    _mpp_log_l(2,"hal_h265e_v580",fmt,(char *)0x0);
    uVar31 = 0xfffffffffffffffa;
  }
  else {
    if ((*(long *)((long)hal + 0x168) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x168),(long)(iVar39 * 0xc0),
                   "hal_h265e_v580","vepu580_setup_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x168) == (MppBuffer)0x0)) {
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
      goto LAB_00244217;
    }
    uVar31 = 0;
    bVar57 = true;
    if (*(long *)((long)hal + 0x170) == 0) {
      pvVar25 = mpp_osal_malloc("vepu580_setup_qpmap_buf",(long)(iVar39 * 0x10));
      *(void **)((long)hal + 0x170) = pvVar25;
      if (pvVar25 == (void *)0x0) {
        fmt = "md_flag_buf malloc fail, qpmap invalid\n";
        goto LAB_00244217;
      }
    }
  }
LAB_0024422a:
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","vepu580_setup_qpmap_buf",uVar31 & 0xffffffff);
  }
  if (!bVar57) {
    _mpp_log_l(2,"hal_h265e_v580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00244272:
  lVar30 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x6bc) = *(uint *)((long)__s + 0x6bc) & 0xc0000000 | 0xe34c2ca;
  *(uint *)((long)__s + 0x6c0) = *(uint *)((long)__s + 0x6c0) & 0xc0000000 | 0x74083c9;
  *(uint *)((long)__s + 0x6c4) = *(uint *)((long)__s + 0x6c4) & 0xc0000000 | 0x61c824a;
  *(uint *)((long)__s + 0x6c8) = *(uint *)((long)__s + 0x6c8) & 0xc0000000 | 0xd10c14b;
  *(uint *)((long)__s + 0x6cc) = *(uint *)((long)__s + 0x6cc) & 0xc0000000 | 0xe3d0452;
  *(uint *)((long)__s + 0x6d0) = *(uint *)((long)__s + 0x6d0) & 0xc0000000 | 0x15314353;
  *(uint *)((long)__s + 0x6d4) = *(uint *)((long)__s + 0x6d4) & 0xc0000000 | 0x165544d2;
  *(uint *)((long)__s + 0x6d8) = *(uint *)((long)__s + 0x6d8) & 0xc0000000 | 0xf6105d1;
  *(uint *)((long)__s + 0x6dc) = *(uint *)((long)__s + 0x6dc) & 0xc0000000 | 0x165d8699;
  *(uint *)((long)__s + 0x6e0) = *(uint *)((long)__s + 0x6e0) & 0xc0000000 | 0x1d51c55b;
  *(uint *)((long)__s + 0x6e4) = *(uint *)((long)__s + 0x6e4) & 0xc0000000 | 0x1e75c69b;
  *(uint *)((long)__s + 0x6e8) = *(uint *)((long)__s + 0x6e8) & 0xc0000000 | 0x178187d9;
  *(uint *)((long)__s + 0x6ec) = *(uint *)((long)__s + 0x6ec) & 0xc0000000 | 0x1e7e0862;
  *(uint *)((long)__s + 0x6f0) = *(uint *)((long)__s + 0x6f0) & 0xc0000000 | 0x4703742;
  *(uint *)((long)__s + 0x6f4) = *(uint *)((long)__s + 0x6f4) & 0xc0000000 | 0x51030a2;
  *(uint *)((long)__s + 0x6f8) = *(uint *)((long)__s + 0x6f8) & 0xc0000000 | 0x1f1e01a1;
  *(ulong *)((long)__s + 0x6fc) =
       *(ulong *)((long)__s + 0x6fc) & 0xc0000000c0000000 | (ulong)DAT_002aa970;
  *(uint *)((long)__s + 0x704) = *(uint *)((long)__s + 0x704) & 0xc0000000;
  *(uint *)((long)__s + 0x708) = *(uint *)((long)__s + 0x708) & 0xc0000000;
  *(uint *)((long)__s + 0x70c) = *(uint *)((long)__s + 0x70c) & 0xc0000000;
  *(uint *)((long)__s + 0x710) = *(uint *)((long)__s + 0x710) & 0xc0000000;
  *(uint *)((long)__s + 0x714) = *(uint *)((long)__s + 0x714) & 0xc0000000;
  *(uint *)((long)__s + 0x718) = *(uint *)((long)__s + 0x718) & 0xc0000000;
  *(uint *)((long)__s + 0x71c) = *(uint *)((long)__s + 0x71c) & 0xc0000000;
  *(uint *)((long)__s + 0x720) = *(uint *)((long)__s + 0x720) & 0xc0000000;
  *(uint *)((long)__s + 0x724) = *(uint *)((long)__s + 0x724) & 0xc0000000;
  *(uint *)((long)__s + 0x728) = *(uint *)((long)__s + 0x728) & 0xc0000000;
  *(uint *)((long)__s + 0x72c) = *(uint *)((long)__s + 0x72c) & 0xc0000000;
  *(uint *)((long)__s + 0x730) = *(uint *)((long)__s + 0x730) & 0xc0000000;
  *(uint *)((long)__s + 0x734) = *(uint *)((long)__s + 0x734) & 0xc0000000;
  *(uint *)((long)__s + 0x738) = *(uint *)((long)__s + 0x738) & 0xc0000000;
  *(uint *)((long)__s + 0x73c) = *(uint *)((long)__s + 0x73c) & 0xc0000000;
  *(uint *)((long)__s + 0x740) = *(uint *)((long)__s + 0x740) & 0xc0000000;
  *(ulong *)((long)__s + 0x7bc) =
       *(ulong *)((long)__s + 0x7bc) & 0xc0000000f000f000 | (ulong)DAT_002aa990;
  *(uint *)((long)__s + 0x7c4) = (uint)*(byte *)((long)__s + 0x7c7) << 0x18 | 0x820820;
  *(uint *)((long)__s + 0x7c8) = *(uint *)((long)__s + 0x7c8) & 0x80008000;
  *(uint *)((long)__s + 0x7cc) = *(uint *)((long)__s + 0x7cc) & 0x80008000;
  *(uint *)((long)__s + 2000) = *(uint *)((long)__s + 2000) & 0x80008000;
  *(uint *)((long)__s + 0x7d4) = *(uint *)((long)__s + 0x7d4) & 0x80008000;
  *(uint *)((long)__s + 0x7d8) = *(uint *)((long)__s + 0x7d8) & 0xffff8000;
  *(uint *)((long)__s + 0x7dc) = *(uint *)((long)__s + 0x7dc) & 0xc0000000 | 0xd34d34d;
  *(uint *)((long)__s + 0x7e0) = *(uint *)((long)__s + 0x7e0) & 0xff000000 | 0x34d34d;
  *(uint *)((long)__s + 0x7e4) = *(uint *)((long)__s + 0x7e4) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7e8) = *(uint *)((long)__s + 0x7e8) & 0x80008000 | 0x5cc65cc6;
  *(ulong *)((long)__s + 0x7ec) =
       *(ulong *)((long)__s + 0x7ec) & 0x8000800080008000 | (ulong)DAT_002aa9e0;
  *(uint *)((long)__s + 0x7f4) = *(uint *)((long)__s + 0x7f4) & 0xffff8000 | 0x5cc6;
  *(undefined4 *)((long)__s + 0x7f8) = 20000;
  *(undefined4 *)((long)__s + 0x800) = 20000;
  *(undefined4 *)((long)__s + 0x808) = 20000;
  *(undefined4 *)((long)__s + 0x810) = 20000;
  *(undefined4 *)((long)__s + 0x818) = 20000;
  *(undefined4 *)((long)__s + 0x820) = 20000;
  *(undefined4 *)((long)__s + 0x828) = 20000;
  *(undefined4 *)((long)__s + 0x830) = 20000;
  *(undefined4 *)((long)__s + 0x838) = 20000;
  *(byte *)((long)__s + 0x7fc) = *(byte *)((long)__s + 0x7fc) & 0xfc;
  *(byte *)((long)__s + 0x804) = *(byte *)((long)__s + 0x804) & 0xfc;
  *(byte *)((long)__s + 0x80c) = *(byte *)((long)__s + 0x80c) & 0xfc;
  *(byte *)((long)__s + 0x814) = *(byte *)((long)__s + 0x814) & 0xfc;
  *(byte *)((long)__s + 0x81c) = *(byte *)((long)__s + 0x81c) & 0xfc;
  *(byte *)((long)__s + 0x824) = *(byte *)((long)__s + 0x824) & 0xfc;
  *(byte *)((long)__s + 0x82c) = *(byte *)((long)__s + 0x82c) & 0xfc;
  *(byte *)((long)__s + 0x834) = *(byte *)((long)__s + 0x834) & 0xfc;
  *(byte *)((long)__s + 0x83c) = *(byte *)((long)__s + 0x83c) & 0xfc;
  *(uint *)((long)__s + 0x840) = *(uint *)((long)__s + 0x840) & 0xf000f000 | 0x1900040;
  *(uint *)((long)__s + 0x844) = *(uint *)((long)__s + 0x844) & 0xffffffc0 | 8;
  *(uint *)((long)__s + 0x848) = *(uint *)((long)__s + 0x848) & 0xf000f000 | 0x640064;
  *(uint *)((long)__s + 0x84c) = *(uint *)((long)__s + 0x84c) & 0xc0000000 | 0x12492492;
  *(ulong *)((long)__s + 0x850) = *(ulong *)((long)__s + 0x850) & 0x8000800080008000;
  *(uint *)((long)__s + 0x858) = *(uint *)((long)__s + 0x858) & 0xffff8000;
  *(uint *)((long)__s + 0x85c) = *(uint *)((long)__s + 0x85c) & 0xc0000000 | 0x10410410;
  *(ulong *)((long)__s + 0x860) = *(ulong *)((long)__s + 0x860) & 0x8000800080008000;
  *(uint *)((long)__s + 0x868) = *(uint *)((long)__s + 0x868) & 0xffff8000;
  *(undefined4 *)((long)__s + 0x86c) = 20000;
  *(undefined4 *)((long)__s + 0x874) = 20000;
  *(undefined4 *)((long)__s + 0x87c) = 20000;
  *(undefined4 *)((long)__s + 0x884) = 20000;
  *(undefined4 *)((long)__s + 0x88c) = 20000;
  *(uint *)((long)__s + 0x870) = *(uint *)((long)__s + 0x870) & 0xfffffe00;
  *(uint *)((long)__s + 0x878) = *(uint *)((long)__s + 0x878) & 0xfffffe00;
  *(uint *)((long)__s + 0x880) = *(uint *)((long)__s + 0x880) & 0xfffffe00;
  *(uint *)((long)__s + 0x888) = *(uint *)((long)__s + 0x888) & 0xfffffe00;
  *(uint *)((long)__s + 0x890) = *(uint *)((long)__s + 0x890) & 0xfffffe00;
  *(byte *)((long)__s + 0x894) = *(byte *)((long)__s + 0x894) | 3;
  *(uint *)((long)__s + 0x898) = *(uint *)((long)__s + 0x898) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0x89c) = *(uint *)((long)__s + 0x89c) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0x8a0) = *(uint *)((long)__s + 0x8a0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a4) = *(uint *)((long)__s + 0x8a4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a8) = *(uint *)((long)__s + 0x8a8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8ac) = *(uint *)((long)__s + 0x8ac) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8b0) = *(uint *)((long)__s + 0x8b0) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x8b4) = *(uint *)((long)__s + 0x8b4) & 0xff000000 | 0x101010;
  *(ulong *)((long)__s + 0x8b8) =
       *(ulong *)((long)__s + 0x8b8) & 0xff000000ff000000 | (ulong)DAT_0029f260;
  *(uint *)((long)__s + 0x8c0) = *(uint *)((long)__s + 0x8c0) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x8c4) = *(uint *)((long)__s + 0x8c4) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x8c8) = *(uint *)((long)__s + 0x8c8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8cc) = *(uint *)((long)__s + 0x8cc) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x8d0) =
       *(ulong *)((long)__s + 0x8d0) & 0xf000f000f000f000 | (ulong)DAT_002aaef0;
  *(undefined4 *)((long)__s + 0x8d8) = 0xa0a0a10;
  *(uint *)((long)__s + 0x8dc) = *(uint *)((long)__s + 0x8dc) & 0xff000000 | 0xf0e0e;
  *(uint *)((long)__s + 0x8e0) = *(uint *)((long)__s + 0x8e0) & 0xff000000 | 0x100f0f;
  *(uint *)((long)__s + 0x8e4) = *(uint *)((long)__s + 0x8e4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x8e8) = *(uint *)((long)__s + 0x8e8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x8ec) = *(uint *)((long)__s + 0x8ec) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x8f0) = *(uint *)((long)__s + 0x8f0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f4) = *(uint *)((long)__s + 0x8f4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f8) = *(uint *)((long)__s + 0x8f8) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x8fc) =
       *(ulong *)((long)__s + 0x8fc) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x904) =
       *(ulong *)((long)__s + 0x904) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x90c) =
       *(ulong *)((long)__s + 0x90c) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0x914) =
       *(ulong *)((long)__s + 0x914) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0x91c) =
       *(ulong *)((long)__s + 0x91c) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0x924) =
       *(ulong *)((long)__s + 0x924) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0x92c) = *(uint *)((long)__s + 0x92c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x930) = *(uint *)((long)__s + 0x930) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x934) = *(uint *)((long)__s + 0x934) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x938) = *(uint *)((long)__s + 0x938) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x93c) = *(uint *)((long)__s + 0x93c) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x940) = *(uint *)((long)__s + 0x940) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x944) = *(uint *)((long)__s + 0x944) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x948) = *(uint *)((long)__s + 0x948) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x94c) = *(uint *)((long)__s + 0x94c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x950) = 0xb0b0b12;
  *(uint *)((long)__s + 0x954) = *(uint *)((long)__s + 0x954) & 0xff000000 | 0xd0d0d;
  *(uint *)((long)__s + 0x958) = *(uint *)((long)__s + 0x958) & 0xff000000 | 0xf0f0f;
  *(uint *)((long)__s + 0x95c) = *(uint *)((long)__s + 0x95c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x960) = *(uint *)((long)__s + 0x960) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x964) = *(uint *)((long)__s + 0x964) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x968) = *(uint *)((long)__s + 0x968) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x96c) = *(uint *)((long)__s + 0x96c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x970) = *(uint *)((long)__s + 0x970) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x974) =
       *(ulong *)((long)__s + 0x974) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x97c) =
       *(ulong *)((long)__s + 0x97c) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x984) =
       *(ulong *)((long)__s + 0x984) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0x98c) =
       *(ulong *)((long)__s + 0x98c) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0x994) =
       *(ulong *)((long)__s + 0x994) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0x99c) =
       *(ulong *)((long)__s + 0x99c) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0x9a4) = *(uint *)((long)__s + 0x9a4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9a8) = *(uint *)((long)__s + 0x9a8) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9ac) = *(uint *)((long)__s + 0x9ac) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9b0) = *(uint *)((long)__s + 0x9b0) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0x9b4) = *(uint *)((long)__s + 0x9b4) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0x9b8) = *(uint *)((long)__s + 0x9b8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9bc) = *(uint *)((long)__s + 0x9bc) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c0) = *(uint *)((long)__s + 0x9c0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c4) = *(uint *)((long)__s + 0x9c4) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x9c8) = 0x10101010;
  *(uint *)((long)__s + 0x9cc) = *(uint *)((long)__s + 0x9cc) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d0) = *(uint *)((long)__s + 0x9d0) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d4) = *(uint *)((long)__s + 0x9d4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d8) = *(uint *)((long)__s + 0x9d8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x9dc) = *(uint *)((long)__s + 0x9dc) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x9e0) = *(uint *)((long)__s + 0x9e0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e4) = *(uint *)((long)__s + 0x9e4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e8) = *(uint *)((long)__s + 0x9e8) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x9ec) =
       *(ulong *)((long)__s + 0x9ec) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x9f4) =
       *(ulong *)((long)__s + 0x9f4) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x9fc) =
       *(ulong *)((long)__s + 0x9fc) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0xa04) =
       *(ulong *)((long)__s + 0xa04) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0xa0c) =
       *(ulong *)((long)__s + 0xa0c) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0xa14) =
       *(ulong *)((long)__s + 0xa14) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0xa1c) = *(uint *)((long)__s + 0xa1c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa20) = *(uint *)((long)__s + 0xa20) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa24) = *(uint *)((long)__s + 0xa24) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa28) = *(uint *)((long)__s + 0xa28) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0xa2c) = *(uint *)((long)__s + 0xa2c) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0xa30) = *(uint *)((long)__s + 0xa30) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa34) = *(uint *)((long)__s + 0xa34) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa38) = *(uint *)((long)__s + 0xa38) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa3c) = *(uint *)((long)__s + 0xa3c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0xa40) = 0x10101010;
  uVar40 = *(uint *)((long)__s + 0xa48) & 0xff000000;
  uVar33 = *(uint *)((long)__s + 0xa4c) & 0xff000000;
  *(uint *)((long)__s + 0xa44) = *(uint *)((long)__s + 0xa44) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa48) = uVar40 | 0x101010;
  *(uint *)((long)__s + 0xa4c) = uVar33 | 0x101010;
  *(uint *)((long)__s + 0xa50) = *(uint *)((long)__s + 0xa50) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa54) = *(uint *)((long)__s + 0xa54) & 0xf000 | 0xb410001e;
  *(uint *)((long)__s + 0xa58) = *(uint *)((long)__s + 0xa58) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa5c) = *(uint *)((long)__s + 0xa5c) & 0xccccf000 | 0x3210001e;
  *(uint *)((long)__s + 0xa60) = *(uint *)((long)__s + 0xa60) & 0xff000000 | 0x61616;
  *(uint *)((long)__s + 0xa64) = *(uint *)((long)__s + 0xa64) & 0xf000f000 | 0x200040;
  *(uint *)((long)__s + 0xa68) = *(uint *)((long)__s + 0xa68) & 0xf000f000 | 0x400024;
  *(uint *)((long)__s + 0xa6c) = *(uint *)((long)__s + 0xa6c) & 0x1000f000 | 0xa0040009;
  *(uint *)((long)__s + 0xa70) = *(uint *)((long)__s + 0xa70) & 0xff00ff00 | 0x19001f;
  *(ulong *)((long)__s + 0xa74) =
       *(ulong *)((long)__s + 0xa74) & 0xff00ff001000f000 | (ulong)DAT_002ab060;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b0)];
  uVar18 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar63[3] = 0;
  auVar63._0_3_ = uVar18;
  auVar63._4_3_ = uVar18;
  auVar63[7] = 0;
  auVar63._8_3_ = uVar18;
  auVar63[0xb] = 0;
  auVar63._12_3_ = uVar18;
  auVar63[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x8b0) =
       auVar63 | *(undefined1 (*) [16])((long)__s + 0x8b0) & _DAT_002ab070;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar32 = 0x18;
    if (0x18 < bVar36) {
      uVar32 = (uint)bVar36;
    }
    uVar28 = (uint)bVar36;
    uVar55 = 6;
    if (uVar28 < 6) {
      uVar55 = uVar28;
    }
    auVar63 = _DAT_002ab080 ^ ZEXT516(CONCAT14(bVar36,uVar28));
    auVar64._0_4_ = -(uint)(-0x7ffffffd < auVar63._0_4_);
    auVar64._4_4_ = -(uint)(-0x7ffffff9 < auVar63._4_4_);
    auVar64._8_4_ = -(uint)(0 < auVar63._8_4_);
    auVar64._12_4_ = -(uint)(0 < auVar63._12_4_);
    auVar63 = auVar64 & _DAT_002ab0a0 | ~auVar64 & ZEXT516(CONCAT14(bVar36,uVar28));
    *(ulong *)((long)__s + 0x8c0) =
         CONCAT44(auVar63._4_4_ << 0x10,auVar63._0_4_ << 0x10) |
         CONCAT44(uVar55,uVar32) | *(ulong *)((long)__s + 0x8c0) & (ulong)DAT_0029f240;
    uVar55 = (uint)bVar36;
    uVar32 = 10;
    if (uVar28 < 10) {
      uVar32 = uVar55;
    }
    *(uint *)((long)__s + 0x8d8) = uVar32 * 0x1010100 | uVar55;
    uVar32 = 0xe;
    if (uVar55 < 0xe) {
      uVar32 = uVar55;
    }
    uVar28 = 0xf;
    if (uVar55 < 0xf) {
      uVar28 = uVar55;
    }
    *(uint *)((long)__s + 0x8dc) =
         uVar28 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x8df) << 0x18 | uVar32;
    *(ulong *)((long)__s + 0x8e0) =
         CONCAT44((uint)bVar36 << 8,uVar28 << 8) |
         CONCAT44((uint)bVar36 * 0x10000,(uint)bVar36 * 0x10000) |
         *(ulong *)((long)__s + 0x8e0) & DAT_0029f200 | (ulong)CONCAT14(bVar36,uVar28);
  }
  bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a0)];
  uVar32 = 0x1a;
  if (0x1a < bVar36) {
    uVar32 = (uint)bVar36;
  }
  uVar41 = (uint)bVar36;
  uVar28 = 0x19;
  uVar55 = uVar28;
  if (0x19 < uVar41) {
    uVar55 = uVar41;
  }
  *(uint *)((long)__s + 0x900) =
       uVar55 << 0x10 | uVar55 << 8 | (uint)*(byte *)((long)__s + 0x903) << 0x18 | uVar32;
  uVar32 = 0x18;
  if (0x18 < uVar41) {
    uVar32 = uVar41;
  }
  uVar34 = (uint)bVar36;
  uVar42 = 0x17;
  uVar41 = uVar42;
  if (0x17 < uVar34) {
    uVar41 = uVar34;
  }
  uVar47 = 0x15;
  if (0x15 < uVar34) {
    uVar47 = uVar34;
  }
  *(uint *)((long)__s + 0x904) =
       uVar41 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x907) << 0x18 | uVar55;
  uVar32 = 0x13;
  if (0x13 < uVar34) {
    uVar32 = uVar34;
  }
  uVar55 = 0x12;
  if (0x12 < uVar34) {
    uVar55 = uVar34;
  }
  *(uint *)((long)__s + 0x908) =
       uVar55 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x90b) << 0x18 | uVar47;
  uVar32 = (uint)bVar36;
  *(uint *)((long)__s + 0x90c) =
       uVar32 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x90f) << 0x18 | uVar32;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b4)];
  uVar18 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar59[3] = 0;
  auVar59._0_3_ = uVar18;
  auVar59._4_3_ = uVar18;
  auVar59[7] = 0;
  auVar59._8_3_ = uVar18;
  auVar59[0xb] = 0;
  auVar59._12_3_ = uVar18;
  auVar59[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x928) =
       auVar59 | *(undefined1 (*) [16])((long)__s + 0x928) & _DAT_002ab070;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    uVar32 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    if (0x17 < (int)*(uint *)(lVar30 + 0x2c4)) {
      uVar32 = 0x18;
    }
    bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar55 = *(uint *)((long)__s + 0x938);
    *(uint *)((long)__s + 0x938) = uVar55 & 0xfffff000 | uVar32;
    uVar41 = 0x40000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 4) {
      uVar41 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x938) = uVar55 & 0xf000f000 | uVar32 | uVar41;
    uVar32 = 6;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 6) {
      uVar32 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar55 = *(uint *)((long)__s + 0x93c);
    *(uint *)((long)__s + 0x93c) = uVar55 & 0xfffff000 | uVar32;
    *(uint *)((long)__s + 0x93c) =
         uVar55 & 0xf000f000 | uVar32 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    uVar32 = 0x12;
    if (0x12 < bVar36) {
      uVar32 = (uint)bVar36;
    }
    uVar41 = (uint)bVar36;
    uVar55 = 0xb;
    if (uVar41 < 0xb) {
      uVar55 = uVar41;
    }
    *(uint *)((long)__s + 0x950) = uVar55 << 0x18 | uVar55 << 0x10 | uVar55 << 8 | uVar32;
    auVar63 = _DAT_002ab080 ^ ZEXT516(CONCAT14(bVar36,uVar41));
    auVar60._0_4_ = -(uint)(-0x7ffffff4 < auVar63._0_4_);
    auVar60._4_4_ = -(uint)(-0x7ffffff2 < auVar63._4_4_);
    auVar60._8_4_ = -(uint)(0 < auVar63._8_4_);
    auVar60._12_4_ = -(uint)(0 < auVar63._12_4_);
    auVar63 = auVar60 & _DAT_002ab0c0 | ~auVar60 & ZEXT516(CONCAT14(bVar36,uVar41));
    *(ulong *)((long)__s + 0x954) =
         CONCAT44(auVar63._4_4_ << 0x10,auVar63._0_4_ << 0x10) | auVar63._0_8_ |
         CONCAT44(auVar63._4_4_ << 8,auVar63._0_4_ << 8) |
         *(ulong *)((long)__s + 0x954) & DAT_0029f200;
    *(uint *)((long)__s + 0x95c) =
         (uint)bVar36 << 0x10 | uVar41 << 8 | (uint)*(byte *)((long)__s + 0x95f) << 0x18 |
         (uint)bVar36;
  }
  uVar55 = 0x18;
  bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a4)];
  uVar32 = 0x1a;
  if (0x1a < bVar36) {
    uVar32 = (uint)bVar36;
  }
  uVar34 = (uint)bVar36;
  uVar41 = uVar28;
  if (0x19 < uVar34) {
    uVar41 = uVar34;
  }
  *(uint *)((long)__s + 0x978) =
       uVar41 << 0x10 | uVar41 << 8 | (uint)*(byte *)((long)__s + 0x97b) << 0x18 | uVar32;
  uVar32 = uVar55;
  if (0x18 < uVar34) {
    uVar32 = uVar34;
  }
  uVar47 = (uint)bVar36;
  uVar34 = uVar42;
  if (0x17 < uVar47) {
    uVar34 = uVar47;
  }
  *(uint *)((long)__s + 0x97c) =
       uVar34 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x97f) << 0x18 | uVar41;
  uVar32 = 0x15;
  if (0x15 < uVar47) {
    uVar32 = uVar47;
  }
  uVar41 = 0x13;
  if (0x13 < uVar47) {
    uVar41 = uVar47;
  }
  uVar34 = 0x12;
  if (0x12 < uVar47) {
    uVar34 = uVar47;
  }
  *(uint *)((long)__s + 0x980) =
       uVar34 << 0x10 | uVar41 << 8 | (uint)*(byte *)((long)__s + 0x983) << 0x18 | uVar32;
  *(uint *)((long)__s + 0x984) =
       (uint)bVar36 << 0x10 | (uint)bVar36 << 8 | (uint)*(byte *)((long)__s + 0x987) << 0x18 |
       (uint)bVar36;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b8)];
  uVar18 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar61[3] = 0;
  auVar61._0_3_ = uVar18;
  auVar61._4_3_ = uVar18;
  auVar61[7] = 0;
  auVar61._8_3_ = uVar18;
  auVar61[0xb] = 0;
  auVar61._12_3_ = uVar18;
  auVar61[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x9a0) =
       auVar61 | *(undefined1 (*) [16])((long)__s + 0x9a0) & _DAT_002ab070;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    RVar19 = h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar41 = (uint)(byte)RVar19;
    uVar32 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    if (0x17 < (int)*(uint *)(lVar30 + 0x2c4)) {
      uVar32 = uVar55;
    }
    uVar34 = *(uint *)((long)__s + 0x9b0);
    *(uint *)((long)__s + 0x9b0) = uVar34 & 0xfffff000 | uVar32;
    uVar47 = 0x180000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar47 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x9b0) = uVar34 & 0xf000f000 | uVar32 | uVar47;
    uVar32 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    if (0x2f < (int)*(uint *)(lVar30 + 0x2c4)) {
      uVar32 = 0x30;
    }
    uVar34 = *(uint *)((long)__s + 0x9b4);
    *(uint *)((long)__s + 0x9b4) = uVar34 & 0xfffff000 | uVar32;
    *(uint *)((long)__s + 0x9b4) =
         uVar34 & 0xf000f000 | uVar32 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    uVar32 = uVar41 << 8;
    uVar34 = (uint)(byte)RVar19 << 0x10;
    *(uint *)((long)__s + 0x9c8) = uVar41 * 0x1010101;
    *(uint *)((long)__s + 0x9cc) =
         (uint)*(byte *)((long)__s + 0x9cf) << 0x18 | uVar41 | uVar32 | uVar34;
    *(uint *)((long)__s + 0x9d0) =
         (uint)*(byte *)((long)__s + 0x9d3) << 0x18 | uVar41 | uVar32 | uVar34;
    *(uint *)((long)__s + 0x9d4) =
         (uint)*(byte *)((long)__s + 0x9d7) << 0x18 | uVar41 | uVar32 | uVar34;
  }
  bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a8)];
  uVar32 = 0x1a;
  if (0x1a < bVar36) {
    uVar32 = (uint)bVar36;
  }
  uVar41 = (uint)bVar36;
  if (0x19 < uVar41) {
    uVar28 = uVar41;
  }
  *(uint *)((long)__s + 0x9f0) =
       uVar28 << 0x10 | uVar28 << 8 | (uint)*(byte *)((long)__s + 0x9f3) << 0x18 | uVar32;
  uVar32 = uVar55;
  if (0x18 < uVar41) {
    uVar32 = uVar41;
  }
  uVar41 = (uint)bVar36;
  if (0x17 < uVar41) {
    uVar42 = uVar41;
  }
  uVar34 = 0x15;
  if (0x15 < uVar41) {
    uVar34 = uVar41;
  }
  *(uint *)((long)__s + 0x9f4) =
       uVar42 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x9f7) << 0x18 | uVar28;
  uVar32 = 0x13;
  if (0x13 < uVar41) {
    uVar32 = uVar41;
  }
  uVar28 = 0x12;
  if (0x12 < uVar41) {
    uVar28 = uVar41;
  }
  *(uint *)((long)__s + 0x9f8) =
       uVar28 << 0x10 | uVar32 << 8 | (uint)*(byte *)((long)__s + 0x9fb) << 0x18 | uVar34;
  *(uint *)((long)__s + 0x9fc) =
       (uint)bVar36 << 0x10 | (uint)bVar36 << 8 | (uint)*(byte *)((long)__s + 0x9ff) << 0x18 |
       (uint)bVar36;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 700)];
  uVar18 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar62[3] = 0;
  auVar62._0_3_ = uVar18;
  auVar62._4_3_ = uVar18;
  auVar62[7] = 0;
  auVar62._8_3_ = uVar18;
  auVar62[0xb] = 0;
  auVar62._12_3_ = uVar18;
  auVar62[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0xa18) =
       auVar62 | *(undefined1 (*) [16])((long)__s + 0xa18) & _DAT_002ab070;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar36 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar55 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar32 = *(uint *)((long)__s + 0xa28);
    *(uint *)((long)__s + 0xa28) = uVar32 & 0xfffff000 | uVar55;
    uVar28 = 0x180000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar28 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0xa28) = uVar32 & 0xf000f000 | uVar55 | uVar28;
    uVar32 = 0x30;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x30) {
      uVar32 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar55 = *(uint *)((long)__s + 0xa2c);
    *(uint *)((long)__s + 0xa2c) = uVar55 & 0xfffff000 | uVar32;
    *(uint *)((long)__s + 0xa2c) =
         uVar55 & 0xf000f000 | uVar32 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    *(uint *)((long)__s + 0xa40) = (uint)bVar36 * 0x1010101;
    uVar32 = (uint)bVar36 << 0x10;
    *(uint *)((long)__s + 0xa44) =
         (uint)*(byte *)((long)__s + 0xa47) << 0x18 | (uint)bVar36 | (uint)bVar36 << 8 | uVar32;
    *(uint *)((long)__s + 0xa48) = uVar40 | uVar32 | (uint)CONCAT11(bVar36,bVar36);
    *(uint *)((long)__s + 0xa4c) = uVar33 | uVar32 | (uint)CONCAT11(bVar36,bVar36);
  }
  if ((hal_h265e_debug & 1) == 0) {
    memcpy((void *)((long)__s + 0xa94),vepu580_h265_scl_cfg_vepu580_h265_scl_tab,0xa98);
  }
  else {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_h265_scl_cfg");
    RVar19 = hal_h265e_debug;
    memcpy((void *)((long)__s + 0xa94),vepu580_h265_scl_cfg_vepu580_h265_scl_tab,0xa98);
    if ((RVar19 & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_h265_scl_cfg");
    }
  }
  memcpy((void *)((long)__s + 0x3bc),lamd_satd_qp,0xd0);
  if (*(int *)((long)hal + 0xb0) == 2) {
    for (lVar27 = 0; lVar27 != 0x10; lVar27 = lVar27 + 1) {
      *(undefined1 *)((long)__s + lVar27 + 0x21c) = *(undefined1 *)(lVar30 + 0x198 + lVar27 * 4);
      *(byte *)((long)__s + lVar27 + 0x22c) = *(byte *)(lVar30 + 0x218 + lVar27 * 4) & 0x3f;
    }
    pRVar43 = lamd_moda_qp;
  }
  else {
    for (lVar27 = 0; lVar27 != 0x10; lVar27 = lVar27 + 1) {
      *(undefined1 *)((long)__s + lVar27 + 0x21c) = *(undefined1 *)(lVar30 + 0x1d8 + lVar27 * 4);
      *(byte *)((long)__s + lVar27 + 0x22c) = *(byte *)(lVar30 + 600 + lVar27 * 4) & 0x3f;
    }
    pRVar43 = lamd_modb_qp;
  }
  memcpy((void *)((long)__s + 0x4bc),pRVar43,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(ulong *)((long)__s + 0x248) =
       *(ulong *)((long)__s + 0x248) & 0xff000000ff000000 | (ulong)DAT_002ab0d0;
  *(uint *)((long)__s + 0x2ec) = *(uint *)((long)__s + 0x2ec) & 0xfff00000 | 0x154ab;
  *(undefined8 *)((long)__s + 700) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2c4) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2d8) = 0x1a181614151617;
  *(undefined8 *)((long)__s + 0x2e0) = 0x12121112111111;
  *(ulong *)((long)__s + 0x31c) =
       *(ulong *)((long)__s + 0x31c) & 0xe0080200fffffcf8 | 0x801402000000304;
  *(ulong *)((long)__s + 0x324) =
       *(ulong *)((long)__s + 0x324) & 0xfc00fc00fc00fc00 | 0x60006000200010;
  *(ulong *)((long)__s + 0x32c) =
       *(ulong *)((long)__s + 0x32c) & 0xc0000000f0f0f000 | 0x800401008030030;
  *(ulong *)((long)__s + 0x334) =
       *(ulong *)((long)__s + 0x334) & 0xfff0f000f000f000 | 0x1001000100010;
  plVar15 = *(long **)((long)hal + 0x150);
  if (plVar15 != (long *)0x0) {
    lVar30 = *plVar15;
    lVar27 = *(long *)(lVar30 + 200);
    uVar40 = (uint)(*(int *)(lVar27 + 0x1864) != 1);
    *(uint *)((long)plVar15 + 0xc) = uVar40;
    uVar40 = uVar40 * 2 + (int)plVar15[1];
    if (uVar40 < 4) {
      lVar14 = *(long *)(*(long *)(lVar30 + 0x80) + 0x18);
      iVar39 = *(int *)(lVar27 + 0x1894);
      uVar31 = 3;
      if (iVar39 == 0) {
        uVar31 = (ulong)uVar40;
      }
      aRVar16 = lvl32_preintra_cst_wgt[uVar31];
      *(RK_U8 (*) [8])(lVar14 + 0x2d8) = aRVar16;
      *(RK_U8 (*) [8])(lVar14 + 0x2e0) = aRVar16;
      if (*(int *)(lVar27 + 0x2c0) == 0) {
        lVar17 = *(long *)(*(long *)(lVar30 + 0x80) + 0x18);
        uVar31 = 3;
        if (*(int *)(*(long *)(lVar30 + 200) + 0x1894) == 0) {
          uVar31 = (ulong)uVar40;
        }
        *(ulong *)(lVar17 + 0x8c0) =
             *(ulong *)(lVar17 + 0x8c0) & 0xf000f000f000f000 | 0x6000400020001;
        *(uint *)(lVar17 + 0x8d8) =
             skip_b64_atf_wgt[uVar31][3] * 0x1000000 +
             ((skip_b64_atf_wgt[uVar31][2] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar31][1] & 0xffU) << 8) + 0x10;
        *(uint *)(lVar17 + 0x8dc) =
             (skip_b64_atf_wgt[uVar31][6] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar31][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar17 + 0x8df) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar31][4];
        *(uint *)(lVar17 + 0x8e0) =
             (skip_b64_atf_wgt[uVar31][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar17 + 0x8e3) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar31][7] |
             0x100000;
        *(ulong *)(lVar17 + 0x8e4) =
             *(ulong *)(lVar17 + 0x8e4) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar17 + 0x8ec) = *(uint *)(lVar17 + 0x8ec) & 0xfffff000 | 0x40;
        uVar42 = intra_b32_atf_wgt[uVar31][0] & 0xff;
        uVar34 = intra_b32_atf_wgt[uVar31][3] & 0xff;
        uVar47 = intra_b32_atf_wgt[uVar31][6] & 0xff;
        uVar48 = intra_b32_atf_wgt[uVar31][9] & 0xff;
        uVar49 = (intra_b32_atf_wgt[uVar31][1] & 0xffU) << 8;
        uVar51 = (intra_b32_atf_wgt[uVar31][4] & 0xffU) << 8;
        uVar38 = (intra_b32_atf_wgt[uVar31][7] & 0xffU) << 8;
        uVar20 = (intra_b32_atf_wgt[uVar31][10] & 0xffU) << 8;
        uVar21 = (intra_b32_atf_wgt[uVar31][2] & 0xffU) << 0x10;
        uVar29 = (intra_b32_atf_wgt[uVar31][5] & 0xffU) << 0x10;
        uVar53 = (intra_b32_atf_wgt[uVar31][8] & 0xffU) << 0x10;
        uVar44 = (intra_b32_atf_wgt[uVar31][0xb] & 0xffU) << 0x10;
        *(uint *)(lVar17 + 0x900) =
             *(uint *)(lVar17 + 0x900) & 0xff000000 | uVar42 | uVar49 | uVar21;
        *(uint *)(lVar17 + 0x904) =
             *(uint *)(lVar17 + 0x904) & 0xff000000 | uVar34 | uVar51 | uVar29;
        *(uint *)(lVar17 + 0x908) =
             *(uint *)(lVar17 + 0x908) & 0xff000000 | uVar47 | uVar38 | uVar53;
        *(uint *)(lVar17 + 0x90c) =
             *(uint *)(lVar17 + 0x90c) & 0xff000000 | uVar48 | uVar20 | uVar44;
        *(ulong *)(lVar17 + 0x938) =
             *(ulong *)(lVar17 + 0x938) & 0xf000f000f000f000 | 0x6000400020001;
        *(uint *)(lVar17 + 0x950) =
             (skip_b32_atf_wgt[uVar31][2] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar31][1] & 0xffU) << 8 | (uint)(byte)skip_b32_atf_wgt[uVar31][0] |
             skip_b32_atf_wgt[uVar31][3] << 0x18;
        *(uint *)(lVar17 + 0x954) =
             (skip_b32_atf_wgt[uVar31][6] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar31][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar17 + 0x957) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar31][4];
        *(uint *)(lVar17 + 0x958) =
             (skip_b32_atf_wgt[uVar31][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar17 + 0x95b) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar31][7] |
             0x100000;
        *(ulong *)(lVar17 + 0x95c) =
             *(ulong *)(lVar17 + 0x95c) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar17 + 0x964) = *(uint *)(lVar17 + 0x964) & 0xfffff000 | 0x40;
        *(uint *)(lVar17 + 0x978) =
             *(uint *)(lVar17 + 0x978) & 0xff000000 | uVar42 | uVar49 | uVar21;
        *(uint *)(lVar17 + 0x97c) =
             *(uint *)(lVar17 + 0x97c) & 0xff000000 | uVar34 | uVar51 | uVar29;
        *(uint *)(lVar17 + 0x980) =
             *(uint *)(lVar17 + 0x980) & 0xff000000 | uVar47 | uVar38 | uVar53;
        *(uint *)(lVar17 + 0x984) =
             *(uint *)(lVar17 + 0x984) & 0xff000000 | uVar48 | uVar20 | uVar44;
        *(ulong *)(lVar17 + 0x9b0) =
             *(ulong *)(lVar17 + 0x9b0) & 0xf000f000f000f000 | 0x6000400020001;
        iVar56 = skip_b16_atf_wgt[uVar31][3] * 0x1000000 +
                 ((skip_b16_atf_wgt[uVar31][2] & 0xffU) << 0x10 |
                 (skip_b16_atf_wgt[uVar31][1] & 0xffU) << 8) + 0x10;
        *(int *)(lVar17 + 0x9c8) = iVar56;
        uVar41 = (uint)(byte)skip_b16_atf_wgt[uVar31][4];
        uVar55 = (skip_b16_atf_wgt[uVar31][5] & 0xffU) << 8;
        uVar28 = (skip_b16_atf_wgt[uVar31][6] & 0xffU) << 0x10;
        *(uint *)(lVar17 + 0x9cc) =
             (uint)*(byte *)(lVar17 + 0x9cf) << 0x18 | uVar41 | uVar55 | uVar28;
        uVar32 = (skip_b16_atf_wgt[uVar31][8] & 0xffU) << 8;
        uVar33 = (uint)(byte)skip_b16_atf_wgt[uVar31][7];
        *(uint *)(lVar17 + 0x9d0) =
             (uint)*(byte *)(lVar17 + 0x9d3) << 0x18 | uVar33 | uVar32 | 0x100000;
        *(ulong *)(lVar17 + 0x9d4) =
             *(ulong *)(lVar17 + 0x9d4) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar17 + 0x9dc) = *(uint *)(lVar17 + 0x9dc) & 0xfffff000 | 0x40;
        *(uint *)(lVar17 + 0x9f0) =
             *(uint *)(lVar17 + 0x9f0) & 0xff000000 | uVar42 | uVar49 | uVar21;
        *(uint *)(lVar17 + 0x9f4) =
             *(uint *)(lVar17 + 0x9f4) & 0xff000000 | uVar34 | uVar51 | uVar29;
        *(uint *)(lVar17 + 0x9f8) =
             *(uint *)(lVar17 + 0x9f8) & 0xff000000 | uVar47 | uVar38 | uVar53;
        *(uint *)(lVar17 + 0x9fc) =
             *(uint *)(lVar17 + 0x9fc) & 0xff000000 | uVar48 | uVar20 | uVar44;
        *(ulong *)(lVar17 + 0xa28) =
             *(ulong *)(lVar17 + 0xa28) & 0xf000f000f000f000 | 0x6000400020001;
        *(int *)(lVar17 + 0xa40) = iVar56;
        *(uint *)(lVar17 + 0xa44) =
             (uint)*(byte *)(lVar17 + 0xa47) << 0x18 | uVar41 | uVar55 | uVar28;
        *(uint *)(lVar17 + 0xa48) =
             (uint)*(byte *)(lVar17 + 0xa4b) << 0x18 | uVar33 | uVar32 | 0x100000;
        *(uint *)(lVar17 + 0xa4c) = (uint)*(byte *)(lVar17 + 0xa4f) << 0x18 | 0x101010;
      }
      uVar32 = (uint)(byte)pre_intra_b32_cost[uVar40][0];
      uVar33 = (pre_intra_b32_cost[uVar40][1] & 0xffU) << 0x10;
      *(uint *)(lVar14 + 0xa70) = *(uint *)(lVar14 + 0xa70) & 0xff00ff00 | uVar32 | uVar33;
      *(uint *)(lVar14 + 0xa78) = *(uint *)(lVar14 + 0xa78) & 0xff00ff00 | uVar32 | uVar33;
      *(ulong *)(lVar14 + 0x248) =
           *(ulong *)(lVar14 + 0x248) & 0xff000000ff000000 | (ulong)DAT_002ab150;
      *(uint *)(lVar14 + 0x31c) =
           (*(uint *)(lVar14 + 0x31c) & 0xfffffffb) + (uint)((int)plVar15[1] == 0) * 4;
      *(ulong *)(lVar14 + 0x324) =
           CONCAT44(cime_multi[uVar40][3] << 0x10,4) & 0x3ff0000ffffffff |
           *(ulong *)(lVar14 + 0x324) & (ulong)DAT_0029f3d0 |
           CONCAT44(cime_multi[uVar40][2],cime_multi[uVar40][1] << 0x10) & (ulong)DAT_0029f3c0;
      *(uint *)(lVar14 + 0x330) =
           (rime_multi[uVar40][2] & 0x3ffU) * 0x100000 +
           (*(uint *)(lVar14 + 0x330) & 0xc0000000 | (rime_multi[uVar40][1] & 0x3ffU) << 10) + 4;
      if ((int)plVar15[1] != 0) {
        *(uint *)(lVar14 + 0x338) = *(uint *)(lVar14 + 0x338) & 0xfff0ffff | 0x80000;
      }
      if (iVar39 == 0) {
        uVar32 = *(uint *)(lVar14 + 0x894) & 0xfffffffe | (uint)((int)plVar15[1] == 0);
        *(uint *)(lVar14 + 0x894) = uVar32;
        uVar33 = (uint)((int)plVar15[1] == 0) * 2;
      }
      else {
        uVar32 = *(uint *)(lVar14 + 0x894) & 0xfffffffe;
        uVar33 = 0;
      }
      *(uint *)(lVar14 + 0x894) = uVar32 & 0xfffffffd | uVar33;
      *(RK_U32 *)(lVar14 + 0x7c0) =
           (intra_lvl16_sobel_a[uVar40][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_a[uVar40][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar40][2] & 0x3f) << 0xc |
           (intra_lvl16_sobel_a[uVar40][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x7c0) & 0xc0000000 | intra_lvl16_sobel_a[uVar40][0] & 0x3f;
      *(RK_U32 *)(lVar14 + 0x7c4) =
           (intra_lvl16_sobel_a[uVar40][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar40][7] & 0x3f) << 0xc |
           (intra_lvl16_sobel_a[uVar40][6] & 0x3f) << 6 |
           intra_lvl16_sobel_a[uVar40][5] & 0x3f | (uint)*(byte *)(lVar14 + 0x7c7) << 0x18;
      *(RK_U32 *)(lVar14 + 0x7dc) =
           (intra_lvl16_sobel_c[uVar40][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_c[uVar40][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar40][2] & 0x3f) << 0xc |
           (intra_lvl16_sobel_c[uVar40][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x7dc) & 0xc0000000 | intra_lvl16_sobel_c[uVar40][0] & 0x3f;
      *(RK_U32 *)(lVar14 + 0x7e0) =
           (intra_lvl16_sobel_c[uVar40][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar40][7] & 0x3f) << 0xc |
           (intra_lvl16_sobel_c[uVar40][6] & 0x3f) << 6 |
           intra_lvl16_sobel_c[uVar40][5] & 0x3f | (uint)*(byte *)(lVar14 + 0x7e3) << 0x18;
      uVar33 = intra_lvl16_sobel_d[uVar40][6];
      uVar32 = intra_lvl16_sobel_d[uVar40][4];
      uVar55 = intra_lvl16_sobel_d[uVar40][2];
      uVar28 = intra_lvl16_sobel_d[uVar40][7];
      uVar41 = intra_lvl16_sobel_d[uVar40][5];
      uVar42 = intra_lvl16_sobel_d[uVar40][3];
      *(RK_U32 *)(lVar14 + 0x7e4) =
           (intra_lvl16_sobel_d[uVar40][1] & 0x7fff) << 0x10 |
           *(uint *)(lVar14 + 0x7e4) & 0x80008000 | intra_lvl16_sobel_d[uVar40][0] & 0x7fff;
      *(uint *)(lVar14 + 0x7e8) =
           (uVar42 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7e8) & 0x80008000 | uVar55 & 0x7fff;
      *(uint *)(lVar14 + 0x7ec) =
           (uVar41 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7ec) & 0x80008000 | uVar32 & 0x7fff;
      *(uint *)(lVar14 + 0x7f0) =
           (uVar28 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7f0) & 0x80008000 | uVar33 & 0x7fff;
      *(uint *)(lVar14 + 0x7f4) =
           *(uint *)(lVar14 + 0x7f4) & 0xffff8000 | intra_lvl16_sobel_d[uVar40][8] & 0x7fff;
      *(RK_U32 *)(lVar14 + 0x84c) =
           (intra_lvl32_sobel_a[uVar40][4] & 0x3f) << 0x18 |
           (intra_lvl32_sobel_a[uVar40][3] & 0x3f) << 0x12 |
           (intra_lvl32_sobel_a[uVar40][2] & 0x3f) << 0xc |
           (intra_lvl32_sobel_a[uVar40][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x84c) & 0xc0000000 | intra_lvl32_sobel_a[uVar40][0] & 0x3f;
      *(uint *)(lVar14 + 0x85c) = *(uint *)(lVar14 + 0x85c) & 0xc0000000 | 0x10410410;
      if (*(int *)(lVar27 + 0x18c) == 0) {
        *(RK_U32 *)(lVar14 + 0x2ec) =
             (qnt_bias_p[uVar40] & 0x3ff) * 0x400 + (*(uint *)(lVar14 + 0x2ec) & 0xfff00000) + 0x80;
      }
      else {
        uVar33 = 0xab;
        if (*(uint *)(lVar27 + 0x184) != 0) {
          uVar33 = *(uint *)(lVar27 + 0x184) & 0x3ff;
        }
        uVar32 = *(uint *)(lVar14 + 0x2ec);
        *(uint *)(lVar14 + 0x2ec) = uVar32 & 0xfffffc00 | uVar33;
        uVar55 = 0x15400;
        if (*(uint *)(lVar27 + 0x188) != 0) {
          uVar55 = (*(uint *)(lVar27 + 0x188) & 0x3ff) << 10;
        }
        *(uint *)(lVar14 + 0x2ec) = uVar32 & 0xfff00000 | uVar33 | uVar55;
      }
      *(uint *)(lVar14 + 0x32c) =
           *(uint *)(lVar14 + 0x32c) & 0xfffff000 | rime_sqi_cime_sad_th[uVar40] & 0xfff;
      uVar33 = fme_sqi_cime_sad_pu16_th[uVar40] & 0xfff;
      *(RK_U32 *)(lVar14 + 0x334) =
           (fme_sqi_cime_sad_pu16_th[uVar40] & 0xfff) << 0x10 |
           *(uint *)(lVar14 + 0x334) & 0xf000f000 | uVar33;
      *(uint *)(lVar14 + 0x338) = *(uint *)(lVar14 + 0x338) & 0xfffff000 | uVar33;
      *(uint *)(lVar14 + 600) = *(uint *)(lVar14 + 600) & 0xfffffff8 | chrm_klut_ofst[uVar40] & 7;
    }
    else {
      _mpp_log_l(2,"hal_h265e_v580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h265e_tune_reg_patch");
    }
  }
  uVar6 = *(undefined4 *)(lVar9 + 0x28);
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_setup_split");
  }
  iVar39 = *(int *)(lVar11 + 0xe94);
  if (iVar39 == 2) {
    iVar39 = *(int *)(lVar11 + 0xc);
    iVar56 = *(int *)(lVar11 + 0x10);
    uVar40 = *(uint *)(lVar11 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar11 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar7 = *(int *)(lVar11 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar7 != 0) << 0x1e;
    if (((*(byte *)(lVar11 + 0xe9c) & 1) != 0) ||
       ((bVar36 = (byte)uVar6 >> 7, iVar7 != 0 &&
        (0x20 < (uint)(CONCAT44(0 >> bVar36,
                                (iVar56 + 0x3f >> 6) * ((uint)(iVar39 + 0x3f >> 6) >> bVar36) +
                                uVar40 + -1) / (ulong)uVar40))))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar39 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar11 + 0xe98) & 0xfffff;
    uVar40 = (uint)(*(int *)(lVar11 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar40;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar40 >> 0x1b;
  }
  else if (iVar39 == 0) {
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(ulong *)((long)__s + 0x140) = *(ulong *)((long)__s + 0x140) & 0xfff0000080007ff8;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h265e_v580","invalide slice split mode %d\n","vepu580_setup_split");
  }
  *(undefined4 *)(lVar11 + 0xe90) = 0;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_setup_split");
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xb07);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v580_gen_regs(void *hal, HalEncTask *task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    EncRcTask *rc_task = enc_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    H265eSyntax_new *syn = ctx->syn;
    Vepu580H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV580RegSet *regs = frm_cfg->regs_set[0];
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd64, pic_h64;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu580_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu580_base        *reg_base = &regs->reg_base;
    hevc_vepu580_rc_klut *reg_klut = &regs->reg_rc_klut;
    MppEncCfgSet *cfg = ctx->cfg;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd64 = (syn->pp.pic_width + 63) / 64;
    pic_h64 = (syn->pp.pic_height + 63) / 64;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         frm_cfg->frame_count, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV580RegSet));

    if (ctx->task_cnt > 1)
        setup_vepu580_dual_core(ctx);

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en         = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en    = 1;
    reg_ctl->reg0008_int_en.sclr_done_en        = 1;
    reg_ctl->reg0008_int_en.slc_done_en         = 0;
    reg_ctl->reg0008_int_en.bsf_oflw_en         = 1;
    reg_ctl->reg0008_int_en.brsp_otsd_en        = 1;
    reg_ctl->reg0008_int_en.wbus_err_en         = 1;
    reg_ctl->reg0008_int_en.rbus_err_en         = 1;
    reg_ctl->reg0008_int_en.wdg_en              = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en      = 0;

    reg_ctl->reg0012_dtrns_map.lpfw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.cmvw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.dspw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.rfpw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.afbc_bsize       = 0x1;
    reg_ctl->reg0012_dtrns_map.ebufw_bus_ordr   = 0x0;

    reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = ceil(log2((double)pic_wd64 * pic_h64));

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;
    reg_base->reg0203_src_proc.txa_en   = 1;
    reg_base->reg0203_src_proc.afbcd_en = (MPP_FRAME_FMT_IS_FBC(syn->pp.mpp_format)) ? 1 : 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 0 : 3;
    memcpy(&reg_klut->klut_wgt0, &klut_weight[0], sizeof(klut_weight));

    vepu580_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 1;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x06db;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xf;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }

        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu580_h265_set_hw_address(ctx, task);
    vepu580_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu580_h265_set_rc_regs(ctx, regs, task);
    vepu580_h265_set_slice_regs(syn, reg_base);
    vepu580_h265_set_ref_regs(syn, reg_base);

    vepu580_set_osd(&ctx->frm->osd_cfg);
    /* ROI configure */
    vepu580_h265_set_roi_regs(ctx, reg_base);
    if (frm->is_i_refresh)
        setup_intra_refresh(ctx, frm->seq_idx % ctx->cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC && task->md_info &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != vepu580_setup_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    /*paramet cfg*/
    vepu580_h265_global_cfg_set(ctx, regs);

    vepu580_h265e_tune_reg_patch(ctx->tune);

    vepu580_setup_split(regs, cfg, syn->pp.tiles_enabled_flag);

    hal_h265e_leave();
    return MPP_OK;
}